

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::NodeLoader::begin__bind_vertex_input
          (NodeLoader *this,bind_vertex_input__AttributeData *attributeData)

{
  FilePartLoader *this_00;
  TextureCoordinateBinding texCoordinateBinding;
  allocator<char> local_71;
  String local_70;
  undefined1 local_50 [24];
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  if (this->mCurrentInstanceController != (InstanceController *)0x0 ||
      this->mCurrentInstanceGeometry != (InstanceGeometry *)0x0) {
    local_38._M_p = (pointer)&local_28;
    local_50._0_8_ = &PTR__TextureCoordinateBinding_00a03708;
    local_30 = 0;
    local_28._M_local_buf[0] = '\0';
    local_50._16_8_ = attributeData->input_set;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,attributeData->semantic,&local_71);
    std::__cxx11::string::_M_assign((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_70);
    this_00 = (this->super_HelperLoaderBase).mHandlingFilePartLoader;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,attributeData->semantic,&local_71);
    local_50._8_8_ =
         IFilePartLoader::getTextureMapIdBySematic(&this_00->super_IFilePartLoader,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::
    _Rb_tree<COLLADAFW::TextureCoordinateBinding,COLLADAFW::TextureCoordinateBinding,std::_Identity<COLLADAFW::TextureCoordinateBinding>,std::less<COLLADAFW::TextureCoordinateBinding>,std::allocator<COLLADAFW::TextureCoordinateBinding>>
    ::_M_insert_unique<COLLADAFW::TextureCoordinateBinding_const&>
              ((_Rb_tree<COLLADAFW::TextureCoordinateBinding,COLLADAFW::TextureCoordinateBinding,std::_Identity<COLLADAFW::TextureCoordinateBinding>,std::less<COLLADAFW::TextureCoordinateBinding>,std::allocator<COLLADAFW::TextureCoordinateBinding>>
                *)&this->mCurrentTextureCoordinateBindings,(TextureCoordinateBinding *)local_50);
    COLLADAFW::TextureCoordinateBinding::~TextureCoordinateBinding
              ((TextureCoordinateBinding *)local_50);
  }
  return true;
}

Assistant:

bool NodeLoader::begin__bind_vertex_input( const bind_vertex_input__AttributeData& attributeData )
	{
        if ( mCurrentInstanceGeometry || mCurrentInstanceController )
        {
            COLLADAFW::TextureCoordinateBinding texCoordinateBinding;
            texCoordinateBinding.setSetIndex ( (size_t)attributeData.input_set );
            texCoordinateBinding.setSemantic( attributeData.semantic );
            texCoordinateBinding.setTextureMapId ( getHandlingFilePartLoader()->getTextureMapIdBySematic( attributeData.semantic ) );
            mCurrentTextureCoordinateBindings.insert(texCoordinateBinding);
        }
		return true;
	}